

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_CoordSys.cpp
# Opt level: O0

Real __thiscall amrex::CoordSys::AreaHi(CoordSys *this,IntVect *point,int dir)

{
  int in_EDX;
  literals *in_RDI;
  undefined1 local_2c [20];
  double local_18;
  undefined1 *local_10;
  
  local_10 = local_2c;
  if (in_EDX == 0) {
    local_18 = *(double *)(in_RDI + 0x28) * *(double *)(in_RDI + 0x30);
  }
  else if (in_EDX == 1) {
    local_18 = *(double *)(in_RDI + 0x20) * *(double *)(in_RDI + 0x30);
  }
  else if (in_EDX == 2) {
    local_18 = *(double *)(in_RDI + 0x28) * *(double *)(in_RDI + 0x20);
  }
  else {
    local_18 = literals::operator____rt(in_RDI,(longdouble)0);
  }
  return local_18;
}

Assistant:

Real
CoordSys::AreaHi (const IntVect& point, int dir) const noexcept
{
    amrex::ignore_unused(point,dir);
#if (AMREX_SPACEDIM==2)
    Real xhi[AMREX_SPACEDIM];
    switch (c_sys)
    {
    case cartesian:
        switch (dir)
        {
        case 0: return dx[1];
        case 1: return dx[0];
        }
        return 0._rt; // to silent compiler warning
    case RZ:
        HiNode(point,xhi);
        switch (dir)
        {
        case 0: return Real(TWOPI)*dx[1]*xhi[0];
        case 1: return (xhi[0]*xhi[0]-(xhi[0]-dx[0])*(xhi[0]-dx[0]))*static_cast<Real>(TWOPI*0.5);
        }
        return 0._rt; // to silent compiler warning
    default:
        AMREX_ASSERT(0);
    }
#endif
#if (AMREX_SPACEDIM==3)
    switch (dir)
    {
    case 0: return dx[1]*dx[2];
    case 1: return dx[0]*dx[2];
    case 2: return dx[1]*dx[0];
    }
#endif
    return 0._rt;
}